

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# WorkerQueue.h
# Opt level: O1

void __thiscall
WorkerQueue<ReadMergerWorker<DNA>,_std::pair<std::deque<Sequence<DNA>,_std::allocator<Sequence<DNA>_>_>,_std::deque<Sequence<DNA>,_std::allocator<Sequence<DNA>_>_>_>,_WorkerQueue<MergedReadWriterWorker<DNA>,_std::deque<Sequence<DNA>,_std::allocator<Sequence<DNA>_>_>,_const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&>_*>
::Enqueue(WorkerQueue<ReadMergerWorker<DNA>,_std::pair<std::deque<Sequence<DNA>,_std::allocator<Sequence<DNA>_>_>,_std::deque<Sequence<DNA>,_std::allocator<Sequence<DNA>_>_>_>,_WorkerQueue<MergedReadWriterWorker<DNA>,_std::deque<Sequence<DNA>,_std::allocator<Sequence<DNA>_>_>,_const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&>_*>
          *this,pair<std::deque<Sequence<DNA>,_std::allocator<Sequence<DNA>_>_>,_std::deque<Sequence<DNA>,_std::allocator<Sequence<DNA>_>_>_>
                *queueItem)

{
  _Map_pointer ppSVar1;
  undefined1 local_30 [8];
  unique_lock<std::mutex> lock;
  
  local_30 = (undefined1  [8])(this + 0x80);
  lock._M_device._0_1_ = 0;
  std::unique_lock<std::mutex>::lock((unique_lock<std::mutex> *)local_30);
  lock._M_device._0_1_ = 1;
  ppSVar1 = (queueItem->first).super__Deque_base<Sequence<DNA>,_std::allocator<Sequence<DNA>_>_>.
            _M_impl.super__Deque_impl_data._M_finish._M_node;
  *(ulong *)(this + 0x100) =
       ((long)(queueItem->first).super__Deque_base<Sequence<DNA>,_std::allocator<Sequence<DNA>_>_>.
              _M_impl.super__Deque_impl_data._M_finish._M_cur -
        (long)(queueItem->first).super__Deque_base<Sequence<DNA>,_std::allocator<Sequence<DNA>_>_>.
              _M_impl.super__Deque_impl_data._M_finish._M_first >> 5) * -0x5555555555555555 +
       (((long)ppSVar1 -
         (long)(queueItem->first).super__Deque_base<Sequence<DNA>,_std::allocator<Sequence<DNA>_>_>.
               _M_impl.super__Deque_impl_data._M_start._M_node >> 3) + -1 +
       (ulong)(ppSVar1 == (_Map_pointer)0x0)) * 5 + *(long *)(this + 0x100) +
       ((long)(queueItem->first).super__Deque_base<Sequence<DNA>,_std::allocator<Sequence<DNA>_>_>.
              _M_impl.super__Deque_impl_data._M_start._M_last -
        (long)(queueItem->first).super__Deque_base<Sequence<DNA>,_std::allocator<Sequence<DNA>_>_>.
              _M_impl.super__Deque_impl_data._M_start._M_cur >> 5) * -0x5555555555555555;
  std::
  deque<std::pair<std::deque<Sequence<DNA>,std::allocator<Sequence<DNA>>>,std::deque<Sequence<DNA>,std::allocator<Sequence<DNA>>>>,std::allocator<std::pair<std::deque<Sequence<DNA>,std::allocator<Sequence<DNA>>>,std::deque<Sequence<DNA>,std::allocator<Sequence<DNA>>>>>>
  ::
  emplace_back<std::pair<std::deque<Sequence<DNA>,std::allocator<Sequence<DNA>>>,std::deque<Sequence<DNA>,std::allocator<Sequence<DNA>>>>>
            ((deque<std::pair<std::deque<Sequence<DNA>,std::allocator<Sequence<DNA>>>,std::deque<Sequence<DNA>,std::allocator<Sequence<DNA>>>>,std::allocator<std::pair<std::deque<Sequence<DNA>,std::allocator<Sequence<DNA>>>,std::deque<Sequence<DNA>,std::allocator<Sequence<DNA>>>>>>
              *)(this + 0xb0),queueItem);
  std::unique_lock<std::mutex>::~unique_lock((unique_lock<std::mutex> *)local_30);
  std::condition_variable::notify_one();
  return;
}

Assistant:

void Enqueue( QueueItem& queueItem ) {
    {
      std::unique_lock< std::mutex > lock( mQueueMutex );
      mTotalEnqueued += QueueItemInfo< QueueItem >::Count( queueItem );
      mQueue.push( std::move( queueItem ) );
    }

    // Send one worker to work
    mCondition.notify_one();
  }